

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

void __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::ExplicitProducer::~ExplicitProducer(ExplicitProducer *this)

{
  ulong uVar1;
  FreeList<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block>
  *pFVar2;
  atomic<unsigned_int> *paVar3;
  __int_type_conflict1 _Var4;
  ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
  *pCVar5;
  void *pvVar6;
  void *__ptr;
  ulong uVar7;
  ulong uVar8;
  __pointer_type pBVar9;
  __pointer_type pBVar10;
  Block *pBVar11;
  Block *pBVar12;
  bool bVar13;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ExplicitProducer_0035b740;
  pBVar11 = (this->super_ProducerBase).tailBlock;
  if (pBVar11 != (Block *)0x0) {
    if (((this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i & 0x1f) == 0)
    {
      pBVar12 = (Block *)0x0;
    }
    else {
      uVar7 = this->pr_blockIndexFront - this->pr_blockIndexSlotsUsed;
      do {
        uVar8 = uVar7 & this->pr_blockIndexSize - 1;
        uVar7 = uVar8 + 1;
      } while (0x8000000000000000 <
               (this->pr_blockIndexEntries[uVar8].base -
               (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i) + 0x20)
      ;
      pBVar12 = this->pr_blockIndexEntries[uVar8].block;
    }
    do {
      pBVar11 = pBVar11->next;
      if ((pBVar11->emptyFlags[0]._M_base._M_i & 1U) == 0) {
        bVar13 = false;
      }
      else {
        uVar7 = 0;
        do {
          uVar8 = uVar7;
          bVar13 = 0x1e < uVar8;
          if (uVar8 == 0x1f) goto LAB_001f548a;
          uVar7 = uVar8 + 1;
        } while ((pBVar11->emptyFlags[uVar8 + 1]._M_base._M_i & 1U) != 0);
        bVar13 = 0x1e < uVar8;
      }
LAB_001f548a:
      if (!bVar13) {
        if (pBVar11 == pBVar12) {
          uVar7 = (ulong)((uint)(this->super_ProducerBase).headIndex.
                                super___atomic_base<unsigned_long>._M_i & 0x1f);
        }
        else {
          uVar7 = 0;
        }
        if (((this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i & 0x1f) ==
            0) {
          uVar8 = 0x20;
        }
        else {
          uVar8 = (ulong)((uint)(this->super_ProducerBase).tailIndex.
                                super___atomic_base<unsigned_long>._M_i & 0x1f);
        }
        do {
          if ((uVar8 == uVar7) && (pBVar11 == (this->super_ProducerBase).tailBlock)) break;
          uVar1 = uVar7 + 1;
          std::
          unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
          ~unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                       *)(pBVar11->elements + (ulong)((uint)uVar7 & 0x1f) * 8));
          uVar7 = uVar1;
        } while (uVar1 != 0x20);
      }
    } while (pBVar11 != (this->super_ProducerBase).tailBlock);
  }
  pBVar11 = (this->super_ProducerBase).tailBlock;
  if (pBVar11 != (Block *)0x0) {
    do {
      pBVar12 = pBVar11->next;
      if (pBVar11->dynamicallyAllocated == true) {
        free(pBVar11);
      }
      else {
        pCVar5 = (this->super_ProducerBase).parent;
        LOCK();
        paVar3 = &pBVar11->freeListRefs;
        _Var4 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        (paVar3->super___atomic_base<unsigned_int>)._M_i =
             (paVar3->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
        UNLOCK();
        if (_Var4 == 0) {
          pBVar9 = (pCVar5->freeList).freeListHead._M_b._M_p;
          do {
            (pBVar11->freeListNext)._M_b._M_p = pBVar9;
            (pBVar11->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
            pFVar2 = &pCVar5->freeList;
            LOCK();
            pBVar10 = (pFVar2->freeListHead)._M_b._M_p;
            bVar13 = pBVar9 == pBVar10;
            if (bVar13) {
              (pFVar2->freeListHead)._M_b._M_p = pBVar11;
              pBVar10 = pBVar9;
            }
            UNLOCK();
            if (bVar13) break;
            LOCK();
            paVar3 = &pBVar11->freeListRefs;
            _Var4 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
            (paVar3->super___atomic_base<unsigned_int>)._M_i =
                 (paVar3->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
            UNLOCK();
            pBVar9 = pBVar10;
          } while (_Var4 == 1);
        }
      }
      pBVar11 = pBVar12;
    } while (pBVar12 != (this->super_ProducerBase).tailBlock);
  }
  __ptr = this->pr_blockIndexRaw;
  while (__ptr != (void *)0x0) {
    pvVar6 = *(void **)((long)__ptr + 0x18);
    free(__ptr);
    __ptr = pvVar6;
  }
  return;
}

Assistant:

~ExplicitProducer() {
      // Destruct any elements not yet dequeued.
      // Since we're in the destructor, we can assume all elements
      // are either completely dequeued or completely not (no halfways).
      if (this->tailBlock !=
          nullptr) {  // Note this means there must be a block index too
        // First find the block that's partially dequeued, if any
        Block* halfDequeuedBlock = nullptr;
        if ((this->headIndex.load(std::memory_order_relaxed) &
             static_cast<index_t>(QUEUE_BLOCK_SIZE - 1)) != 0) {
          // The head's not on a block boundary, meaning a block somewhere is
          // partially dequeued (or the head block is the tail block and was
          // fully dequeued, but the head/tail are still not on a boundary)
          size_t i = (pr_blockIndexFront - pr_blockIndexSlotsUsed) &
                     (pr_blockIndexSize - 1);
          while (details::circular_less_than<index_t>(
              pr_blockIndexEntries[i].base + QUEUE_BLOCK_SIZE,
              this->headIndex.load(std::memory_order_relaxed))) {
            i = (i + 1) & (pr_blockIndexSize - 1);
          }
          assert(details::circular_less_than<index_t>(
              pr_blockIndexEntries[i].base,
              this->headIndex.load(std::memory_order_relaxed)));
          halfDequeuedBlock = pr_blockIndexEntries[i].block;
        }

        // Start at the head block (note the first line in the loop gives us the
        // head from the tail on the first iteration)
        auto block = this->tailBlock;
        do {
          block = block->next;
          if (block->ConcurrentQueue::Block::template is_empty<
                  explicit_context>()) {
            continue;
          }

          size_t i = 0;  // Offset into block
          if (block == halfDequeuedBlock) {
            i = static_cast<size_t>(
                this->headIndex.load(std::memory_order_relaxed) &
                static_cast<index_t>(QUEUE_BLOCK_SIZE - 1));
          }

          // Walk through all the items in the block; if this is the tail block,
          // we need to stop when we reach the tail index
          auto lastValidIndex =
              (this->tailIndex.load(std::memory_order_relaxed) &
               static_cast<index_t>(QUEUE_BLOCK_SIZE - 1)) == 0
                  ? QUEUE_BLOCK_SIZE
                  : static_cast<size_t>(
                        this->tailIndex.load(std::memory_order_relaxed) &
                        static_cast<index_t>(QUEUE_BLOCK_SIZE - 1));
          while (i != QUEUE_BLOCK_SIZE &&
                 (block != this->tailBlock || i != lastValidIndex)) {
            (*block)[i++]->~T();
          }
        } while (block != this->tailBlock);
      }

      // Destroy all blocks that we own
      if (this->tailBlock != nullptr) {
        auto block = this->tailBlock;
        do {
          auto nextBlock = block->next;
          this->parent->add_block_to_free_list(block);
          block = nextBlock;
        } while (block != this->tailBlock);
      }

      // Destroy the block indices
      auto header = static_cast<BlockIndexHeader*>(pr_blockIndexRaw);
      while (header != nullptr) {
        auto prev = static_cast<BlockIndexHeader*>(header->prev);
        header->~BlockIndexHeader();
        (Traits::free)(header);
        header = prev;
      }
    }